

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_backup_step(sqlite3_backup *p,int nPage)

{
  Pgno iSrcPg_00;
  sqlite3_backup *p_00;
  int iVar1;
  Pager *pPager;
  u8 *zSrcData;
  void *pBuf;
  bool bVar2;
  DbPage *local_d0;
  u8 *zData;
  DbPage *pDStack_90;
  Pgno iSrcPg_1;
  PgHdr *pSrcPg_1;
  DbPage *pPg;
  i64 iEnd;
  i64 iOff;
  int nDstPage;
  Pgno iPg;
  sqlite3_file *pFile;
  i64 iSize;
  int ratio;
  int nDestTruncate;
  DbPage *pSrcPg;
  Pgno iSrcPg;
  int bCloseTrans;
  int nSrcPage;
  int ii;
  Pager *pDestPager;
  Pager *pSrcPager;
  int local_20;
  int pgszDest;
  int pgszSrc;
  int destMode;
  int rc;
  int nPage_local;
  sqlite3_backup *p_local;
  
  local_20 = 0;
  pSrcPager._4_4_ = 0;
  destMode = nPage;
  _rc = p;
  sqlite3_mutex_enter(p->pSrcDb->mutex);
  sqlite3BtreeEnter(_rc->pSrc);
  if (_rc->pDestDb != (sqlite3 *)0x0) {
    sqlite3_mutex_enter(_rc->pDestDb->mutex);
  }
  pgszSrc = _rc->rc;
  iVar1 = isFatalError(pgszSrc);
  if (iVar1 == 0) {
    pDestPager = sqlite3BtreePager(_rc->pSrc);
    _nSrcPage = sqlite3BtreePager(_rc->pDest);
    iSrcPg = 0xffffffff;
    pSrcPg._4_4_ = 0;
    if ((_rc->pDestDb == (sqlite3 *)0x0) || (_rc->pSrc->pBt->inTransaction != '\x02')) {
      pgszSrc = 0;
    }
    else {
      pgszSrc = 5;
    }
    if ((pgszSrc == 0) && (iVar1 = sqlite3BtreeIsInReadTrans(_rc->pSrc), iVar1 == 0)) {
      pgszSrc = sqlite3BtreeBeginTrans(_rc->pSrc,0);
      pSrcPg._4_4_ = 1;
    }
    if (((_rc->bDestLocked == 0) && (pgszSrc == 0)) && (iVar1 = setDestPgsz(_rc), iVar1 == 7)) {
      pgszSrc = 7;
    }
    if (((pgszSrc == 0) && (_rc->bDestLocked == 0)) &&
       (pgszSrc = sqlite3BtreeBeginTrans(_rc->pDest,2), pgszSrc == 0)) {
      _rc->bDestLocked = 1;
      sqlite3BtreeGetMeta(_rc->pDest,1,&_rc->iDestSchema);
    }
    local_20 = sqlite3BtreeGetPageSize(_rc->pSrc);
    pSrcPager._4_4_ = sqlite3BtreeGetPageSize(_rc->pDest);
    pPager = sqlite3BtreePager(_rc->pDest);
    pgszDest = sqlite3PagerGetJournalMode(pPager);
    if (((pgszSrc == 0) && (pgszDest == 5)) && (local_20 != pSrcPager._4_4_)) {
      pgszSrc = 8;
    }
    iSrcPg = sqlite3BtreeLastPage(_rc->pSrc);
    bCloseTrans = 0;
    while( true ) {
      if (((destMode < 0) || (bVar2 = false, bCloseTrans < destMode)) &&
         (bVar2 = false, _rc->iNext <= iSrcPg)) {
        bVar2 = pgszSrc == 0;
      }
      if (!bVar2) break;
      pSrcPg._0_4_ = _rc->iNext;
      if (((Pgno)pSrcPg != (uint)sqlite3PendingByte / _rc->pSrc->pBt->pageSize + 1) &&
         (pgszSrc = sqlite3PagerGet(pDestPager,(Pgno)pSrcPg,(DbPage **)&ratio,2), p_00 = _rc,
         iSrcPg_00 = (Pgno)pSrcPg, pgszSrc == 0)) {
        zSrcData = (u8 *)sqlite3PagerGetData(_ratio);
        pgszSrc = backupOnePage(p_00,iSrcPg_00,zSrcData,0);
        sqlite3PagerUnref(_ratio);
      }
      _rc->iNext = _rc->iNext + 1;
      bCloseTrans = bCloseTrans + 1;
    }
    if (pgszSrc == 0) {
      _rc->nPagecount = iSrcPg;
      _rc->nRemaining = (iSrcPg + 1) - _rc->iNext;
      if (iSrcPg < _rc->iNext) {
        pgszSrc = 0x65;
      }
      else if (_rc->isAttached == 0) {
        attachBackupObject(_rc);
      }
    }
    if (pgszSrc == 0x65) {
      if (iSrcPg == 0) {
        pgszSrc = sqlite3BtreeNewDb(_rc->pDest);
        iSrcPg = 1;
      }
      if ((pgszSrc == 0) || (pgszSrc == 0x65)) {
        pgszSrc = sqlite3BtreeUpdateMeta(_rc->pDest,1,_rc->iDestSchema + 1);
      }
      if (pgszSrc == 0) {
        if (_rc->pDestDb != (sqlite3 *)0x0) {
          sqlite3ResetAllSchemasOfConnection(_rc->pDestDb);
        }
        if (pgszDest == 5) {
          pgszSrc = sqlite3BtreeSetVersion(_rc->pDest,2);
        }
      }
      if (pgszSrc == 0) {
        if (local_20 < pSrcPager._4_4_) {
          iSize._0_4_ = pSrcPager._4_4_ / local_20;
          iSize._4_4_ = (int)(iSrcPg + (int)iSize + -1) / (int)iSize;
          if (iSize._4_4_ == (uint)sqlite3PendingByte / _rc->pDest->pBt->pageSize + 1) {
            iSize._4_4_ = iSize._4_4_ - 1;
          }
        }
        else {
          iSize._4_4_ = iSrcPg * (local_20 / pSrcPager._4_4_);
        }
        if (local_20 < pSrcPager._4_4_) {
          pFile = (sqlite3_file *)((long)local_20 * (long)(int)iSrcPg);
          _nDstPage = sqlite3PagerFile(_nSrcPage);
          sqlite3PagerPagecount(_nSrcPage,(int *)&iOff);
          for (iOff._4_4_ = iSize._4_4_; pgszSrc == 0 && iOff._4_4_ <= (uint)iOff;
              iOff._4_4_ = iOff._4_4_ + 1) {
            if ((iOff._4_4_ != (uint)sqlite3PendingByte / _rc->pDest->pBt->pageSize + 1) &&
               (pgszSrc = sqlite3PagerGet(_nSrcPage,iOff._4_4_,&pSrcPg_1,0), pgszSrc == 0)) {
              pgszSrc = sqlite3PagerWrite(pSrcPg_1);
              sqlite3PagerUnref(pSrcPg_1);
            }
          }
          if (pgszSrc == 0) {
            pgszSrc = sqlite3PagerCommitPhaseOne(_nSrcPage,(char *)0x0,1);
          }
          if ((long)(sqlite3PendingByte + pSrcPager._4_4_) < (long)pFile) {
            local_d0 = (DbPage *)(long)(sqlite3PendingByte + pSrcPager._4_4_);
          }
          else {
            local_d0 = (DbPage *)pFile;
          }
          pPg = local_d0;
          for (iEnd = (i64)(sqlite3PendingByte + local_20); pgszSrc == 0 && iEnd < (long)pPg;
              iEnd = local_20 + iEnd) {
            pDStack_90 = (DbPage *)0x0;
            pgszSrc = sqlite3PagerGet(pDestPager,(int)(iEnd / (long)local_20) + 1,
                                      &stack0xffffffffffffff70,0);
            if (pgszSrc == 0) {
              pBuf = sqlite3PagerGetData(pDStack_90);
              pgszSrc = sqlite3OsWrite(_nDstPage,pBuf,local_20,iEnd);
            }
            sqlite3PagerUnref(pDStack_90);
          }
          if (pgszSrc == 0) {
            pgszSrc = backupTruncateFile(_nDstPage,(i64)pFile);
          }
          if (pgszSrc == 0) {
            pgszSrc = sqlite3PagerSync(_nSrcPage,(char *)0x0);
          }
        }
        else {
          sqlite3PagerTruncateImage(_nSrcPage,iSize._4_4_);
          pgszSrc = sqlite3PagerCommitPhaseOne(_nSrcPage,(char *)0x0,0);
        }
        if ((pgszSrc == 0) && (pgszSrc = sqlite3BtreeCommitPhaseTwo(_rc->pDest,0), pgszSrc == 0)) {
          pgszSrc = 0x65;
        }
      }
    }
    if (pSrcPg._4_4_ != 0) {
      sqlite3BtreeCommitPhaseOne(_rc->pSrc,(char *)0x0);
      sqlite3BtreeCommitPhaseTwo(_rc->pSrc,0);
    }
    if (pgszSrc == 0xc0a) {
      pgszSrc = 7;
    }
    _rc->rc = pgszSrc;
  }
  if (_rc->pDestDb != (sqlite3 *)0x0) {
    sqlite3_mutex_leave(_rc->pDestDb->mutex);
  }
  sqlite3BtreeLeave(_rc->pSrc);
  sqlite3_mutex_leave(_rc->pSrcDb->mutex);
  return pgszSrc;
}

Assistant:

SQLITE_API int sqlite3_backup_step(sqlite3_backup *p, int nPage){
  int rc;
  int destMode;       /* Destination journal mode */
  int pgszSrc = 0;    /* Source page size */
  int pgszDest = 0;   /* Destination page size */

#ifdef SQLITE_ENABLE_API_ARMOR
  if( p==0 ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(p->pSrcDb->mutex);
  sqlite3BtreeEnter(p->pSrc);
  if( p->pDestDb ){
    sqlite3_mutex_enter(p->pDestDb->mutex);
  }

  rc = p->rc;
  if( !isFatalError(rc) ){
    Pager * const pSrcPager = sqlite3BtreePager(p->pSrc);     /* Source pager */
    Pager * const pDestPager = sqlite3BtreePager(p->pDest);   /* Dest pager */
    int ii;                            /* Iterator variable */
    int nSrcPage = -1;                 /* Size of source db in pages */
    int bCloseTrans = 0;               /* True if src db requires unlocking */

    /* If the source pager is currently in a write-transaction, return
    ** SQLITE_BUSY immediately.
    */
    if( p->pDestDb && p->pSrc->pBt->inTransaction==TRANS_WRITE ){
      rc = SQLITE_BUSY;
    }else{
      rc = SQLITE_OK;
    }

    /* If there is no open read-transaction on the source database, open
    ** one now. If a transaction is opened here, then it will be closed
    ** before this function exits.
    */
    if( rc==SQLITE_OK && 0==sqlite3BtreeIsInReadTrans(p->pSrc) ){
      rc = sqlite3BtreeBeginTrans(p->pSrc, 0);
      bCloseTrans = 1;
    }

    /* If the destination database has not yet been locked (i.e. if this
    ** is the first call to backup_step() for the current backup operation),
    ** try to set its page size to the same as the source database. This
    ** is especially important on ZipVFS systems, as in that case it is
    ** not possible to create a database file that uses one page size by
    ** writing to it with another.  */
    if( p->bDestLocked==0 && rc==SQLITE_OK && setDestPgsz(p)==SQLITE_NOMEM ){
      rc = SQLITE_NOMEM;
    }

    /* Lock the destination database, if it is not locked already. */
    if( SQLITE_OK==rc && p->bDestLocked==0
     && SQLITE_OK==(rc = sqlite3BtreeBeginTrans(p->pDest, 2)) 
    ){
      p->bDestLocked = 1;
      sqlite3BtreeGetMeta(p->pDest, BTREE_SCHEMA_VERSION, &p->iDestSchema);
    }

    /* Do not allow backup if the destination database is in WAL mode
    ** and the page sizes are different between source and destination */
    pgszSrc = sqlite3BtreeGetPageSize(p->pSrc);
    pgszDest = sqlite3BtreeGetPageSize(p->pDest);
    destMode = sqlite3PagerGetJournalMode(sqlite3BtreePager(p->pDest));
    if( SQLITE_OK==rc && destMode==PAGER_JOURNALMODE_WAL && pgszSrc!=pgszDest ){
      rc = SQLITE_READONLY;
    }
  
    /* Now that there is a read-lock on the source database, query the
    ** source pager for the number of pages in the database.
    */
    nSrcPage = (int)sqlite3BtreeLastPage(p->pSrc);
    assert( nSrcPage>=0 );
    for(ii=0; (nPage<0 || ii<nPage) && p->iNext<=(Pgno)nSrcPage && !rc; ii++){
      const Pgno iSrcPg = p->iNext;                 /* Source page number */
      if( iSrcPg!=PENDING_BYTE_PAGE(p->pSrc->pBt) ){
        DbPage *pSrcPg;                             /* Source page object */
        rc = sqlite3PagerGet(pSrcPager, iSrcPg, &pSrcPg,PAGER_GET_READONLY);
        if( rc==SQLITE_OK ){
          rc = backupOnePage(p, iSrcPg, sqlite3PagerGetData(pSrcPg), 0);
          sqlite3PagerUnref(pSrcPg);
        }
      }
      p->iNext++;
    }
    if( rc==SQLITE_OK ){
      p->nPagecount = nSrcPage;
      p->nRemaining = nSrcPage+1-p->iNext;
      if( p->iNext>(Pgno)nSrcPage ){
        rc = SQLITE_DONE;
      }else if( !p->isAttached ){
        attachBackupObject(p);
      }
    }
  
    /* Update the schema version field in the destination database. This
    ** is to make sure that the schema-version really does change in
    ** the case where the source and destination databases have the
    ** same schema version.
    */
    if( rc==SQLITE_DONE ){
      if( nSrcPage==0 ){
        rc = sqlite3BtreeNewDb(p->pDest);
        nSrcPage = 1;
      }
      if( rc==SQLITE_OK || rc==SQLITE_DONE ){
        rc = sqlite3BtreeUpdateMeta(p->pDest,1,p->iDestSchema+1);
      }
      if( rc==SQLITE_OK ){
        if( p->pDestDb ){
          sqlite3ResetAllSchemasOfConnection(p->pDestDb);
        }
        if( destMode==PAGER_JOURNALMODE_WAL ){
          rc = sqlite3BtreeSetVersion(p->pDest, 2);
        }
      }
      if( rc==SQLITE_OK ){
        int nDestTruncate;
        /* Set nDestTruncate to the final number of pages in the destination
        ** database. The complication here is that the destination page
        ** size may be different to the source page size. 
        **
        ** If the source page size is smaller than the destination page size, 
        ** round up. In this case the call to sqlite3OsTruncate() below will
        ** fix the size of the file. However it is important to call
        ** sqlite3PagerTruncateImage() here so that any pages in the 
        ** destination file that lie beyond the nDestTruncate page mark are
        ** journalled by PagerCommitPhaseOne() before they are destroyed
        ** by the file truncation.
        */
        assert( pgszSrc==sqlite3BtreeGetPageSize(p->pSrc) );
        assert( pgszDest==sqlite3BtreeGetPageSize(p->pDest) );
        if( pgszSrc<pgszDest ){
          int ratio = pgszDest/pgszSrc;
          nDestTruncate = (nSrcPage+ratio-1)/ratio;
          if( nDestTruncate==(int)PENDING_BYTE_PAGE(p->pDest->pBt) ){
            nDestTruncate--;
          }
        }else{
          nDestTruncate = nSrcPage * (pgszSrc/pgszDest);
        }
        assert( nDestTruncate>0 );

        if( pgszSrc<pgszDest ){
          /* If the source page-size is smaller than the destination page-size,
          ** two extra things may need to happen:
          **
          **   * The destination may need to be truncated, and
          **
          **   * Data stored on the pages immediately following the 
          **     pending-byte page in the source database may need to be
          **     copied into the destination database.
          */
          const i64 iSize = (i64)pgszSrc * (i64)nSrcPage;
          sqlite3_file * const pFile = sqlite3PagerFile(pDestPager);
          Pgno iPg;
          int nDstPage;
          i64 iOff;
          i64 iEnd;

          assert( pFile );
          assert( nDestTruncate==0 
              || (i64)nDestTruncate*(i64)pgszDest >= iSize || (
                nDestTruncate==(int)(PENDING_BYTE_PAGE(p->pDest->pBt)-1)
             && iSize>=PENDING_BYTE && iSize<=PENDING_BYTE+pgszDest
          ));

          /* This block ensures that all data required to recreate the original
          ** database has been stored in the journal for pDestPager and the
          ** journal synced to disk. So at this point we may safely modify
          ** the database file in any way, knowing that if a power failure
          ** occurs, the original database will be reconstructed from the 
          ** journal file.  */
          sqlite3PagerPagecount(pDestPager, &nDstPage);
          for(iPg=nDestTruncate; rc==SQLITE_OK && iPg<=(Pgno)nDstPage; iPg++){
            if( iPg!=PENDING_BYTE_PAGE(p->pDest->pBt) ){
              DbPage *pPg;
              rc = sqlite3PagerGet(pDestPager, iPg, &pPg, 0);
              if( rc==SQLITE_OK ){
                rc = sqlite3PagerWrite(pPg);
                sqlite3PagerUnref(pPg);
              }
            }
          }
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerCommitPhaseOne(pDestPager, 0, 1);
          }

          /* Write the extra pages and truncate the database file as required */
          iEnd = MIN(PENDING_BYTE + pgszDest, iSize);
          for(
            iOff=PENDING_BYTE+pgszSrc; 
            rc==SQLITE_OK && iOff<iEnd; 
            iOff+=pgszSrc
          ){
            PgHdr *pSrcPg = 0;
            const Pgno iSrcPg = (Pgno)((iOff/pgszSrc)+1);
            rc = sqlite3PagerGet(pSrcPager, iSrcPg, &pSrcPg, 0);
            if( rc==SQLITE_OK ){
              u8 *zData = sqlite3PagerGetData(pSrcPg);
              rc = sqlite3OsWrite(pFile, zData, pgszSrc, iOff);
            }
            sqlite3PagerUnref(pSrcPg);
          }
          if( rc==SQLITE_OK ){
            rc = backupTruncateFile(pFile, iSize);
          }

          /* Sync the database file to disk. */
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerSync(pDestPager, 0);
          }
        }else{
          sqlite3PagerTruncateImage(pDestPager, nDestTruncate);
          rc = sqlite3PagerCommitPhaseOne(pDestPager, 0, 0);
        }
    
        /* Finish committing the transaction to the destination database. */
        if( SQLITE_OK==rc
         && SQLITE_OK==(rc = sqlite3BtreeCommitPhaseTwo(p->pDest, 0))
        ){
          rc = SQLITE_DONE;
        }
      }
    }
  
    /* If bCloseTrans is true, then this function opened a read transaction
    ** on the source database. Close the read transaction here. There is
    ** no need to check the return values of the btree methods here, as
    ** "committing" a read-only transaction cannot fail.
    */
    if( bCloseTrans ){
      TESTONLY( int rc2 );
      TESTONLY( rc2  = ) sqlite3BtreeCommitPhaseOne(p->pSrc, 0);
      TESTONLY( rc2 |= ) sqlite3BtreeCommitPhaseTwo(p->pSrc, 0);
      assert( rc2==SQLITE_OK );
    }
  
    if( rc==SQLITE_IOERR_NOMEM ){
      rc = SQLITE_NOMEM_BKPT;
    }
    p->rc = rc;
  }
  if( p->pDestDb ){
    sqlite3_mutex_leave(p->pDestDb->mutex);
  }
  sqlite3BtreeLeave(p->pSrc);
  sqlite3_mutex_leave(p->pSrcDb->mutex);
  return rc;
}